

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O0

int pk_get_rsapubkey(uchar **p,uchar *end,mbedtls_rsa_context *rsa)

{
  int iVar1;
  size_t local_38;
  size_t len;
  mbedtls_rsa_context *pmStack_28;
  int ret;
  mbedtls_rsa_context *rsa_local;
  uchar *end_local;
  uchar **p_local;
  
  len._4_4_ = 0xffffff92;
  pmStack_28 = rsa;
  rsa_local = (mbedtls_rsa_context *)end;
  end_local = (uchar *)p;
  len._4_4_ = mbedtls_asn1_get_tag(p,end,&local_38,0x30);
  if (len._4_4_ == 0) {
    if ((mbedtls_rsa_context *)(*(long *)end_local + local_38) == rsa_local) {
      len._4_4_ = mbedtls_asn1_get_tag((uchar **)end_local,(uchar *)rsa_local,&local_38,2);
      if (len._4_4_ == 0) {
        len._4_4_ = mbedtls_rsa_import_raw
                              (pmStack_28,*(uchar **)end_local,local_38,(uchar *)0x0,0,(uchar *)0x0,
                               0,(uchar *)0x0,0,(uchar *)0x0,0);
        if (len._4_4_ == 0) {
          *(size_t *)end_local = local_38 + *(long *)end_local;
          len._4_4_ = mbedtls_asn1_get_tag((uchar **)end_local,(uchar *)rsa_local,&local_38,2);
          if (len._4_4_ == 0) {
            len._4_4_ = mbedtls_rsa_import_raw
                                  (pmStack_28,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,
                                   (uchar *)0x0,0,*(uchar **)end_local,local_38);
            if (len._4_4_ == 0) {
              *(size_t *)end_local = local_38 + *(long *)end_local;
              iVar1 = mbedtls_rsa_complete(pmStack_28);
              if ((iVar1 == 0) && (iVar1 = mbedtls_rsa_check_pubkey(pmStack_28), iVar1 == 0)) {
                if (*(mbedtls_rsa_context **)end_local != rsa_local) {
                  return -0x3b66;
                }
                return 0;
              }
              p_local._4_4_ = -0x3b00;
            }
            else {
              p_local._4_4_ = -0x3b00;
            }
          }
          else {
            p_local._4_4_ = len._4_4_ + -0x3b00;
          }
        }
        else {
          p_local._4_4_ = -0x3b00;
        }
      }
      else {
        p_local._4_4_ = len._4_4_ + -0x3b00;
      }
    }
    else {
      p_local._4_4_ = -0x3b66;
    }
  }
  else {
    p_local._4_4_ = len._4_4_ + -0x3b00;
  }
  return p_local._4_4_;
}

Assistant:

static int pk_get_rsapubkey( unsigned char **p,
                             const unsigned char *end,
                             mbedtls_rsa_context *rsa )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY + ret );

    if( *p + len != end )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    /* Import N */
    if( ( ret = mbedtls_asn1_get_tag( p, end, &len, MBEDTLS_ASN1_INTEGER ) ) != 0 )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY + ret );

    if( ( ret = mbedtls_rsa_import_raw( rsa, *p, len, NULL, 0, NULL, 0,
                                        NULL, 0, NULL, 0 ) ) != 0 )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY );

    *p += len;

    /* Import E */
    if( ( ret = mbedtls_asn1_get_tag( p, end, &len, MBEDTLS_ASN1_INTEGER ) ) != 0 )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY + ret );

    if( ( ret = mbedtls_rsa_import_raw( rsa, NULL, 0, NULL, 0, NULL, 0,
                                        NULL, 0, *p, len ) ) != 0 )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY );

    *p += len;

    if( mbedtls_rsa_complete( rsa ) != 0 ||
        mbedtls_rsa_check_pubkey( rsa ) != 0 )
    {
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY );
    }

    if( *p != end )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}